

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__GetGlyphShapeTT(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  long lVar2;
  short *psVar3;
  bool bVar4;
  byte *pbVar5;
  stbtt_int16 sVar6;
  stbtt_uint16 sVar7;
  short sVar8;
  ushort uVar9;
  int iVar10;
  long lVar11;
  stbtt_uint8 *p;
  void *__dest;
  int iVar12;
  undefined8 *in_RDX;
  long in_RDI;
  float fVar13;
  float fVar14;
  float fVar15;
  short y_1;
  short x_1;
  stbtt_vertex *v;
  float n_1;
  float m_1;
  float mtx [6];
  stbtt_vertex *tmp;
  stbtt_vertex *comp_verts;
  int i_1;
  int comp_num_verts;
  stbtt_uint16 gidx;
  stbtt_uint16 flags_1;
  stbtt_uint8 *comp;
  int more;
  stbtt_int16 dy;
  stbtt_int16 dx;
  stbtt_uint8 *points;
  stbtt_int32 scy;
  stbtt_int32 scx;
  stbtt_int32 sy;
  stbtt_int32 sx;
  stbtt_int32 cy;
  stbtt_int32 cx;
  stbtt_int32 y;
  stbtt_int32 x;
  stbtt_int32 start_off;
  stbtt_int32 off;
  stbtt_int32 was_off;
  stbtt_int32 next_move;
  stbtt_int32 n;
  stbtt_int32 m;
  stbtt_int32 j;
  stbtt_int32 i;
  stbtt_int32 ins;
  stbtt_uint8 flagcount;
  stbtt_uint8 flags;
  int g;
  int num_vertices;
  stbtt_vertex *vertices;
  stbtt_uint8 *data;
  stbtt_uint8 *endPtsOfContours;
  stbtt_int16 numberOfContours;
  undefined4 in_stack_fffffffffffffed8;
  stbtt_int32 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  stbtt_int32 in_stack_ffffffffffffff10;
  stbtt_int32 in_stack_ffffffffffffff18;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  int local_bc;
  stbtt_uint8 *local_b0;
  byte *local_a0;
  stbtt_int32 local_98;
  stbtt_int32 local_90;
  stbtt_int32 local_8c;
  int local_88;
  int local_84;
  int local_7c;
  int local_6c;
  int local_60;
  int local_5c;
  byte local_52;
  byte local_51;
  int local_4c;
  void *local_48;
  int local_c;
  
  lVar2 = *(long *)(in_RDI + 8);
  local_48 = (void *)0x0;
  local_4c = 0;
  iVar10 = stbtt__GetGlyfOffset
                     ((stbtt_fontinfo *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      in_stack_fffffffffffffef4);
  *in_RDX = 0;
  if (iVar10 < 0) {
    local_c = 0;
  }
  else {
    sVar6 = ttSHORT((stbtt_uint8 *)(lVar2 + iVar10));
    if (sVar6 < 1) {
      if (sVar6 == -1) {
        local_b0 = (stbtt_uint8 *)(lVar2 + iVar10 + 10);
        local_4c = 0;
        local_48 = (void *)0x0;
        for (uVar9 = 1; uVar9 != 0; uVar9 = uVar9 & 0x20) {
          fVar13 = 1.0;
          fStack_e4 = 0.0;
          local_e0 = 0.0;
          fStack_dc = 1.0;
          local_d8 = 0.0;
          fStack_d4 = 0.0;
          uVar9 = ttSHORT(local_b0);
          ttSHORT(local_b0 + 2);
          p = local_b0 + 4;
          if ((uVar9 & 2) != 0) {
            if ((uVar9 & 1) == 0) {
              local_d8 = (float)(int)(char)*p;
              fStack_d4 = (float)(int)(char)local_b0[5];
              p = local_b0 + 6;
            }
            else {
              sVar6 = ttSHORT(p);
              local_d8 = (float)(int)sVar6;
              sVar6 = ttSHORT(local_b0 + 6);
              fStack_d4 = (float)(int)sVar6;
              p = local_b0 + 8;
            }
          }
          local_b0 = p;
          if ((uVar9 & 8) == 0) {
            if ((uVar9 & 0x40) == 0) {
              if ((uVar9 & 0x80) != 0) {
                sVar6 = ttSHORT(local_b0);
                fVar13 = (float)(int)sVar6 / 16384.0;
                sVar6 = ttSHORT(local_b0 + 2);
                fStack_e4 = (float)(int)sVar6 / 16384.0;
                sVar6 = ttSHORT(local_b0 + 4);
                local_e0 = (float)(int)sVar6 / 16384.0;
                sVar6 = ttSHORT(local_b0 + 6);
                fStack_dc = (float)(int)sVar6 / 16384.0;
                local_b0 = local_b0 + 8;
              }
            }
            else {
              sVar6 = ttSHORT(local_b0);
              fVar13 = (float)(int)sVar6 / 16384.0;
              fStack_e4 = 0.0;
              sVar6 = ttSHORT(local_b0 + 2);
              fStack_dc = (float)(int)sVar6 / 16384.0;
              local_e0 = 0.0;
              local_b0 = local_b0 + 4;
            }
          }
          else {
            sVar6 = ttSHORT(local_b0);
            fVar13 = (float)(int)sVar6 / 16384.0;
            local_b0 = local_b0 + 2;
            local_e0 = 0.0;
            fStack_e4 = 0.0;
            fStack_dc = fVar13;
          }
          fVar14 = sqrtf(fVar13 * fVar13 + fStack_e4 * fStack_e4);
          fVar15 = sqrtf(local_e0 * local_e0 + fStack_dc * fStack_dc);
          iVar10 = stbtt_GetGlyphShape((stbtt_fontinfo *)
                                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                                       ,in_stack_fffffffffffffee4,
                                       (stbtt_vertex **)
                                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                                      );
          if (0 < iVar10) {
            for (local_bc = 0; local_bc < iVar10; local_bc = local_bc + 1) {
              psVar3 = (short *)((long)local_bc * 0xe);
              sVar8 = *psVar3;
              *psVar3 = (short)(int)(fVar14 * (fVar13 * (float)(int)sVar8 +
                                               local_e0 * (float)(int)psVar3[1] + local_d8));
              psVar3[1] = (short)(int)(fVar15 * (fStack_e4 * (float)(int)sVar8 +
                                                 fStack_dc * (float)(int)psVar3[1] + fStack_d4));
              sVar8 = psVar3[2];
              psVar3[2] = (short)(int)(fVar14 * (fVar13 * (float)(int)sVar8 +
                                                 local_e0 * (float)(int)psVar3[3] + local_d8));
              psVar3[3] = (short)(int)(fVar15 * (fStack_e4 * (float)(int)sVar8 +
                                                 fStack_dc * (float)(int)psVar3[3] + fStack_d4));
            }
            __dest = ImGui::MemAlloc(CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            if (__dest == (void *)0x0) {
              if (local_48 != (void *)0x0) {
                ImGui::MemFree((void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                              );
              }
              return 0;
            }
            if (0 < local_4c) {
              memcpy(__dest,local_48,(long)local_4c * 0xe);
            }
            memcpy((void *)((long)__dest + (long)local_4c * 0xe),(void *)0x0,(long)iVar10 * 0xe);
            if (local_48 != (void *)0x0) {
              ImGui::MemFree((void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            }
            ImGui::MemFree((void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            local_4c = iVar10 + local_4c;
            local_48 = __dest;
          }
        }
      }
    }
    else {
      local_51 = 0;
      local_60 = 0;
      bVar4 = false;
      lVar11 = lVar2 + iVar10 + 10;
      sVar7 = ttUSHORT((stbtt_uint8 *)(lVar2 + iVar10 + 10 + (long)((int)sVar6 << 1)));
      local_a0 = (byte *)(lVar2 + iVar10 + (long)((int)sVar6 << 1) + 0xc + (long)(int)(uint)sVar7);
      sVar7 = ttUSHORT((stbtt_uint8 *)(lVar11 + ((int)sVar6 << 1) + -2));
      iVar10 = sVar7 + 1;
      iVar12 = sVar6 * 2;
      local_48 = ImGui::MemAlloc(CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (local_48 == (void *)0x0) {
        return 0;
      }
      local_6c = 0;
      local_52 = 0;
      for (local_5c = 0; local_5c < iVar10; local_5c = local_5c + 1) {
        if (local_52 == 0) {
          local_51 = *local_a0;
          pbVar5 = local_a0 + 1;
          if ((local_51 & 8) != 0) {
            local_52 = local_a0[1];
            pbVar5 = local_a0 + 2;
          }
        }
        else {
          local_52 = local_52 - 1;
          pbVar5 = local_a0;
        }
        local_a0 = pbVar5;
        *(byte *)((long)local_48 + (long)(iVar12 + local_5c) * 0xe + 0xc) = local_51;
      }
      local_7c = 0;
      for (local_5c = 0; local_5c < iVar10; local_5c = local_5c + 1) {
        bVar1 = *(byte *)((long)local_48 + (long)(iVar12 + local_5c) * 0xe + 0xc);
        if ((bVar1 & 2) == 0) {
          if ((bVar1 & 0x10) == 0) {
            local_7c = local_7c + (short)((ushort)*local_a0 * 0x100 + (ushort)local_a0[1]);
            local_a0 = local_a0 + 2;
          }
        }
        else {
          if ((bVar1 & 0x10) == 0) {
            in_stack_ffffffffffffff00 = -(int)(short)(ushort)*local_a0;
          }
          else {
            in_stack_ffffffffffffff00 = (int)(short)(ushort)*local_a0;
          }
          local_7c = in_stack_ffffffffffffff00 + local_7c;
          local_a0 = local_a0 + 1;
        }
        *(short *)((long)local_48 + (long)(iVar12 + local_5c) * 0xe) = (short)local_7c;
      }
      sVar8 = 0;
      for (local_5c = 0; local_5c < iVar10; local_5c = local_5c + 1) {
        bVar1 = *(byte *)((long)local_48 + (long)(iVar12 + local_5c) * 0xe + 0xc);
        if ((bVar1 & 4) == 0) {
          if ((bVar1 & 0x20) == 0) {
            sVar8 = sVar8 + (ushort)*local_a0 * 0x100 + (ushort)local_a0[1];
            local_a0 = local_a0 + 2;
          }
        }
        else {
          uVar9 = (ushort)*local_a0;
          if ((bVar1 & 0x20) == 0) {
            uVar9 = -uVar9;
          }
          sVar8 = uVar9 + sVar8;
          local_a0 = local_a0 + 1;
        }
        *(short *)((long)local_48 + (long)(iVar12 + local_5c) * 0xe + 2) = sVar8;
      }
      local_4c = 0;
      local_98 = 0;
      local_88 = 0;
      local_84 = 0;
      for (local_5c = 0; local_5c < iVar10; local_5c = local_5c + 1) {
        bVar1 = *(byte *)((long)local_48 + (long)(iVar12 + local_5c) * 0xe + 0xc);
        local_8c = (stbtt_int32)*(short *)((long)local_48 + (long)(iVar12 + local_5c) * 0xe);
        local_90 = (stbtt_int32)*(short *)((long)local_48 + (long)(iVar12 + local_5c) * 0xe + 2);
        if (local_6c == local_5c) {
          if (local_5c != 0) {
            local_4c = stbtt__close_shape((stbtt_vertex *)
                                          CONCAT44(in_stack_fffffffffffffef4,local_88),
                                          in_stack_fffffffffffffeec,local_84,
                                          in_stack_fffffffffffffee4,local_98,
                                          in_stack_fffffffffffffedc,in_stack_ffffffffffffff00,
                                          (stbtt_int32)in_stack_ffffffffffffff08,
                                          in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
          }
          if ((bVar1 & 1) == 0) {
            local_98 = local_90;
            if ((*(byte *)((long)local_48 + (long)(iVar12 + local_5c + 1) * 0xe + 0xc) & 1) == 0) {
              local_8c = local_8c + *(short *)((long)local_48 + (long)(iVar12 + local_5c + 1) * 0xe)
                         >> 1;
              local_90 = local_90 +
                         *(short *)((long)local_48 + (long)(iVar12 + local_5c + 1) * 0xe + 2) >> 1;
            }
            else {
              local_8c = (stbtt_int32)
                         *(short *)((long)local_48 + (long)(iVar12 + local_5c + 1) * 0xe);
              local_90 = (stbtt_int32)
                         *(short *)((long)local_48 + (long)(iVar12 + local_5c + 1) * 0xe + 2);
              local_5c = local_5c + 1;
            }
          }
          stbtt_setvertex((stbtt_vertex *)((long)local_48 + (long)local_4c * 0xe),'\x01',local_8c,
                          local_90,0,0);
          bVar4 = false;
          sVar7 = ttUSHORT((stbtt_uint8 *)(lVar11 + (local_60 << 1)));
          local_6c = sVar7 + 1;
          local_60 = local_60 + 1;
          local_4c = local_4c + 1;
        }
        else if ((bVar1 & 1) == 0) {
          if (bVar4) {
            stbtt_setvertex((stbtt_vertex *)((long)local_48 + (long)local_4c * 0xe),'\x03',
                            local_84 + local_8c >> 1,local_88 + local_90 >> 1,local_84,local_88);
            local_4c = local_4c + 1;
          }
          bVar4 = true;
          local_88 = local_90;
          local_84 = local_8c;
        }
        else {
          if (bVar4) {
            stbtt_setvertex((stbtt_vertex *)((long)local_48 + (long)local_4c * 0xe),'\x03',local_8c,
                            local_90,local_84,local_88);
          }
          else {
            stbtt_setvertex((stbtt_vertex *)((long)local_48 + (long)local_4c * 0xe),'\x02',local_8c,
                            local_90,0,0);
          }
          local_4c = local_4c + 1;
          bVar4 = false;
        }
      }
      local_4c = stbtt__close_shape((stbtt_vertex *)CONCAT44(in_stack_fffffffffffffef4,local_88),
                                    in_stack_fffffffffffffeec,local_84,in_stack_fffffffffffffee4,
                                    local_98,in_stack_fffffffffffffedc,in_stack_ffffffffffffff00,
                                    (stbtt_int32)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10
                                    ,in_stack_ffffffffffffff18);
    }
    *in_RDX = local_48;
    local_c = local_4c;
  }
  return local_c;
}

Assistant:

static int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex)); //-V595
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}